

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O2

void parse_arg(int argc,char **argv,double *h,int *cpus)

{
  int iVar1;
  runtime_error *this;
  double dVar2;
  allocator local_39;
  string local_38;
  
  if (argc < 3) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Incorrect input");
  }
  else {
    std::__cxx11::string::string((string *)&local_38,argv[1],&local_39);
    dVar2 = std::__cxx11::stod(&local_38,(size_t *)0x0);
    *h = dVar2;
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,argv[2],&local_39);
    iVar1 = std::__cxx11::stoi(&local_38,(size_t *)0x0,10);
    *cpus = iVar1;
    std::__cxx11::string::~string((string *)&local_38);
    if (0 < *cpus) {
      return;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Cant ran in less than 1 thread");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parse_arg(int argc, char *argv[], double &h, int &cpus){
  if(argc  < 3)
    throw std::runtime_error("Incorrect input");
  try{
    h = std::stod(argv[1]);
    cpus = std::stoi(argv[2]);
  }catch(...){
    throw std::runtime_error("Parsing failed");
  }
  if (cpus < 1){
    throw std::runtime_error("Cant ran in less than 1 thread");
  }
}